

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O3

void ctor_suite::construct_ptr_with_long_double(void)

{
  test_union<void_*,_bool,_int,_long_double> data;
  longdouble *local_28;
  undefined8 local_20;
  longdouble local_18;
  
  local_20 = 2;
  local_28 = (longdouble *)operator_new(0x10);
  local_18 = (longdouble)3.0;
  *local_28 = local_18;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.get<long double>()","3.0L",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x24,"void ctor_suite::construct_ptr_with_long_double()",local_28,&local_18);
  trial::dynamic::detail::small_union<std::allocator<char>,void*,unsigned_long,bool,int,long_double>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<char>,void*,unsigned_long,bool,int,long_double>::destructor,void>
            ((small_union<std::allocator<char>,void*,unsigned_long,bool,int,long_double> *)&local_28
            );
  return;
}

Assistant:

static void call(const storage_type& self, int)
    {
        if (self.index() != storage_type::to_index<Which>::value)
            throw std::runtime_error("");
    }